

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2693:24)>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::_::Void,_kj::_::IdentityFunc<void>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:2693:24)>
          *this,ExceptionOrValue *output)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  Exception *params;
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOrValue local_2e8;
  char local_188;
  ExceptionOrValue local_180;
  char local_20;
  
  local_180.exception.ptr.isSet = false;
  local_20 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_180);
  this_00 = &local_180.exception.ptr.field_1;
  params = (Exception *)0x0;
  if (local_180.exception.ptr.isSet != false) {
    params = (Exception *)this_00;
  }
  if (local_180.exception.ptr.isSet == true) {
    if (Debug::minSeverity < 3) {
      Debug::log<kj::Exception&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0xa85,ERROR,"e",params);
    }
    local_2e8.exception.ptr.isSet = false;
    local_188 = '\x01';
    ExceptionOrValue::operator=(output,&local_2e8);
  }
  else {
    if (local_20 != '\x01') goto LAB_002a14c4;
    local_2e8.exception.ptr.isSet = false;
    local_188 = '\x01';
    ExceptionOrValue::operator=(output,&local_2e8);
  }
  if (&local_2e8 != output) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
    }
    if (local_188 == '\x01') {
      output[1].exception.ptr.isSet = true;
    }
  }
  if (local_2e8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e8.exception.ptr.field_1.value);
  }
LAB_002a14c4:
  if (local_180.exception.ptr.isSet == true) {
    Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }